

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createGeometryPointSizeTests(TestContext *testCtx)

{
  uint arg0;
  uint uVar1;
  TestCaseGroup *pTVar2;
  Flags *pFVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong uVar6;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string name;
  string desc;
  ostringstream local_1a8 [376];
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"point_size","Test point size");
  pFVar3 = createGeometryPointSizeTests::caseFlags;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar2;
  for (uVar6 = 0;
      pTVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, uVar6 != 7; uVar6 = uVar6 + 1) {
    arg0 = *pFVar3;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    uVar1 = (int)uVar6 - 1;
    if (1 < uVar1) {
      std::operator<<((ostream *)local_1a8,"vertex_set");
    }
    if ((0x55UL >> (uVar6 & 0x3f) & 1) == 0) {
      pcVar5 = "_";
      if (uVar1 < 2) {
        pcVar5 = "";
      }
      poVar4 = std::operator<<((ostream *)local_1a8,pcVar5);
      std::operator<<(poVar4,"evaluation_set");
    }
    if (uVar6 == 6) {
      poVar4 = std::operator<<((ostream *)local_1a8,"_");
      std::operator<<(poVar4,"control_pass_eval_add");
    }
    if ((0x4bUL >> (uVar6 & 0x3f) & 1) == 0) {
      pcVar5 = "_";
      if (uVar6 == 2) {
        pcVar5 = "";
      }
      poVar4 = std::operator<<((ostream *)local_1a8,pcVar5);
      std::operator<<(poVar4,"geometry_set");
    }
    if (uVar6 == 6) {
      poVar4 = std::operator<<((ostream *)local_1a8,"_");
      std::operator<<(poVar4,"geometry_add");
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if (1 < uVar1) {
      std::operator<<((ostream *)local_1a8,"set point size in vertex shader");
    }
    if ((0x55UL >> ((byte)uVar6 & 0x3f) & 1) == 0) {
      pcVar5 = ", ";
      if (uVar1 < 2) {
        pcVar5 = "";
      }
      poVar4 = std::operator<<((ostream *)local_1a8,pcVar5);
      std::operator<<(poVar4,"set point size in tessellation evaluation shader");
    }
    if (uVar6 == 6) {
      poVar4 = std::operator<<((ostream *)local_1a8,", ");
      std::operator<<(poVar4,"add to point size in tessellation shader");
    }
    if ((0x4bUL >> ((byte)uVar6 & 0x3f) & 1) == 0) {
      pcVar5 = ", ";
      if (uVar6 == 2) {
        pcVar5 = "";
      }
      poVar4 = std::operator<<((ostream *)local_1a8,pcVar5);
      std::operator<<(poVar4,"set point size in geometry shader");
    }
    if (uVar6 == 6) {
      poVar4 = std::operator<<((ostream *)local_1a8,", ");
      std::operator<<(poVar4,"add to point size in geometry shader");
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    addFunctionCaseWithPrograms<unsigned_int>
              (group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr,&name,&desc,anon_unknown_1::initPrograms,anon_unknown_1::test,arg0);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    pFVar3 = pFVar3 + 1;
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createGeometryPointSizeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "point_size", "Test point size"));

	static const Flags caseFlags[] =
	{
		FLAG_VERTEX_SET,
							FLAG_TESSELLATION_EVALUATION_SET,
																	FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_EVALUATION_SET,
		FLAG_VERTEX_SET |											FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_EVALUATION_SET	|	FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_ADD				|	FLAG_GEOMETRY_ADD,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(caseFlags); ++ndx)
	{
		const std::string name = getTestCaseName       (caseFlags[ndx]);
		const std::string desc = getTestCaseDescription(caseFlags[ndx]);

		addFunctionCaseWithPrograms(group.get(), name, desc, initPrograms, test, caseFlags[ndx]);
	}

	return group.release();
}